

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchAig.c
# Opt level: O0

Aig_Man_t * Dch_DeriveTotalAig(Vec_Ptr_t *vAigs)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Man_t *pAVar3;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int local_4c;
  int local_48;
  int nNodes;
  int k;
  int i;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObjPi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigTotal;
  Aig_Man_t *pAig2;
  Aig_Man_t *pAig;
  Vec_Ptr_t *vAigs_local;
  
  iVar1 = Vec_PtrSize(vAigs);
  if (iVar1 < 1) {
    __assert_fail("Vec_PtrSize(vAigs) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchAig.c"
                  ,0x46,"Aig_Man_t *Dch_DeriveTotalAig(Vec_Ptr_t *)");
  }
  local_4c = 0;
  p = (Aig_Man_t *)Vec_PtrEntry(vAigs,0);
  nNodes = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vAigs);
    if (iVar1 <= nNodes) {
      pAVar3 = Aig_ManStart(local_4c);
      for (local_48 = 0; iVar1 = Vec_PtrSize(vAigs), local_48 < iVar1; local_48 = local_48 + 1) {
        pAVar4 = (Aig_Man_t *)Vec_PtrEntry(vAigs,local_48);
        pAVar5 = Aig_ManConst1(pAVar3);
        pAVar6 = Aig_ManConst1(pAVar4);
        (pAVar6->field_5).pData = pAVar5;
      }
      for (nNodes = 0; iVar1 = Vec_PtrSize(p->vCis), nNodes < iVar1; nNodes = nNodes + 1) {
        Vec_PtrEntry(p->vCis,nNodes);
        pAVar5 = Aig_ObjCreateCi(pAVar3);
        for (local_48 = 0; iVar1 = Vec_PtrSize(vAigs), local_48 < iVar1; local_48 = local_48 + 1) {
          pAVar4 = (Aig_Man_t *)Vec_PtrEntry(vAigs,local_48);
          pAVar6 = Aig_ManCi(pAVar4,nNodes);
          (pAVar6->field_5).pData = pAVar5;
        }
      }
      for (nNodes = 0; iVar1 = Vec_PtrSize(p->vCos), nNodes < iVar1; nNodes = nNodes + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nNodes);
        for (local_48 = 0; iVar1 = Vec_PtrSize(vAigs), local_48 < iVar1; local_48 = local_48 + 1) {
          pAVar4 = (Aig_Man_t *)Vec_PtrEntry(vAigs,local_48);
          pAVar6 = Aig_ManCo(pAVar4,nNodes);
          pAVar6 = Aig_ObjFanin0(pAVar6);
          Dch_DeriveTotalAig_rec(pAVar3,pAVar6);
        }
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        Aig_ObjCreateCo(pAVar3,pAVar5);
      }
      return pAVar3;
    }
    pAVar3 = (Aig_Man_t *)Vec_PtrEntry(vAigs,nNodes);
    iVar1 = Aig_ManCiNum(p);
    iVar2 = Aig_ManCiNum(pAVar3);
    if (iVar1 != iVar2) break;
    iVar1 = Aig_ManCoNum(p);
    iVar2 = Aig_ManCoNum(pAVar3);
    if (iVar1 != iVar2) {
      __assert_fail("Aig_ManCoNum(pAig) == Aig_ManCoNum(pAig2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchAig.c"
                    ,0x4d,"Aig_Man_t *Dch_DeriveTotalAig(Vec_Ptr_t *)");
    }
    iVar1 = Aig_ManNodeNum(pAVar3);
    local_4c = iVar1 + local_4c;
    Aig_ManCleanData(pAVar3);
    nNodes = nNodes + 1;
  }
  __assert_fail("Aig_ManCiNum(pAig) == Aig_ManCiNum(pAig2)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchAig.c"
                ,0x4c,"Aig_Man_t *Dch_DeriveTotalAig(Vec_Ptr_t *)");
}

Assistant:

Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs )
{
    Aig_Man_t * pAig, * pAig2, * pAigTotal;
    Aig_Obj_t * pObj, * pObjPi, * pObjPo;
    int i, k, nNodes;
    assert( Vec_PtrSize(vAigs) > 0 );
    // make sure they have the same number of PIs/POs
    nNodes = 0;
    pAig = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, i )
    {
        assert( Aig_ManCiNum(pAig) == Aig_ManCiNum(pAig2) );
        assert( Aig_ManCoNum(pAig) == Aig_ManCoNum(pAig2) );
        nNodes += Aig_ManNodeNum(pAig2);
        Aig_ManCleanData( pAig2 );
    }
    // map constant nodes
    pAigTotal = Aig_ManStart( nNodes );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
        Aig_ManConst1(pAig2)->pData = Aig_ManConst1(pAigTotal);
    // map primary inputs
    Aig_ManForEachCi( pAig, pObj, i )
    {
        pObjPi = Aig_ObjCreateCi( pAigTotal );
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
            Aig_ManCi( pAig2, i )->pData = pObjPi;
    }
    // construct the AIG in the order of POs
    Aig_ManForEachCo( pAig, pObj, i )
    {
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig2, k )
        {
            pObjPo = Aig_ManCo( pAig2, i );
            Dch_DeriveTotalAig_rec( pAigTotal, Aig_ObjFanin0(pObjPo) );
        }
        Aig_ObjCreateCo( pAigTotal, Aig_ObjChild0Copy(pObj) );
    }
/*
    // mark the cone of the first AIG
    Aig_ManIncrementTravId( pAigTotal );
    Aig_ManForEachObj( pAig, pObj, i )
        if ( pObj->pData ) 
            Aig_ObjSetTravIdCurrent( pAigTotal, pObj->pData );
*/
    // cleanup should not be done
    return pAigTotal;
}